

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  MessageBuilder builder;
  string local_a8;
  StringRef local_88;
  undefined1 local_78 [88];
  
  AssertionResult::AssertionResult(&this->assertionResult,_assertionResult);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  uVar1 = (_totals->assertions).passed;
  uVar2 = (_totals->assertions).failed;
  uVar3 = (_totals->assertions).failedButOk;
  uVar4 = (_totals->assertions).skipped;
  uVar5 = (_totals->testCases).passed;
  uVar6 = (_totals->testCases).failed;
  uVar7 = (_totals->testCases).skipped;
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  (this->totals).testCases.skipped = uVar7;
  (this->totals).testCases.passed = uVar5;
  (this->totals).testCases.failed = uVar6;
  (this->totals).assertions.failedButOk = uVar3;
  (this->totals).assertions.skipped = uVar4;
  (this->totals).assertions.passed = uVar1;
  (this->totals).assertions.failed = uVar2;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    local_a8._M_dataplus._M_p = (this->assertionResult).m_info.lineInfo.file;
    local_a8._M_string_length = (this->assertionResult).m_info.lineInfo.line;
    MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_78,(this->assertionResult).m_info.macroName,
               (SourceLineInfo *)&local_a8,(this->assertionResult).m_resultData.resultType);
    local_88.m_start = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_88.m_size = (this->assertionResult).m_resultData.message._M_string_length;
    StringRef::operator_cast_to_string(&local_a8,&local_88);
    std::__cxx11::string::operator=((string *)(local_78 + 0x20),(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
    emplace_back<Catch::MessageInfo>(&this->infoMessages,(MessageInfo *)(local_78 + 0x10));
    MessageBuilder::~MessageBuilder((MessageBuilder *)local_78);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                    std::vector<MessageInfo> const& _infoMessages,
                                    Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder.m_info.message = static_cast<std::string>(assertionResult.getMessage());

            infoMessages.push_back( CATCH_MOVE(builder.m_info) );
        }
    }